

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

BlindingKeyResponseStruct *
cfd::js::api::ElementsTransactionStructApi::GetIssuanceBlindingKey
          (BlindingKeyResponseStruct *__return_storage_ptr__,
          GetIssuanceBlindingKeyRequestStruct *request)

{
  GetIssuanceBlindingKeyRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetIssuanceBlindingKeyRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetIssuanceBlindingKeyRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetIssuanceBlindingKeyRequestStruct *request_local;
  BlindingKeyResponseStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  BlindingKeyResponseStruct::BlindingKeyResponseStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::
  function<cfd::js::api::BlindingKeyResponseStruct(cfd::js::api::GetIssuanceBlindingKeyRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::GetIssuanceBlindingKey(cfd::js::api::GetIssuanceBlindingKeyRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::BlindingKeyResponseStruct(cfd::js::api::GetIssuanceBlindingKeyRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"GetIssuanceBlindingKey",&local_129);
  ExecuteStructApi<cfd::js::api::GetIssuanceBlindingKeyRequestStruct,cfd::js::api::BlindingKeyResponseStruct>
            ((BlindingKeyResponseStruct *)(local_108 + 0x20),(api *)this,
             (GetIssuanceBlindingKeyRequestStruct *)local_108,&local_128,in_R8);
  BlindingKeyResponseStruct::operator=
            (__return_storage_ptr__,(BlindingKeyResponseStruct *)(local_108 + 0x20));
  BlindingKeyResponseStruct::~BlindingKeyResponseStruct
            ((BlindingKeyResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetIssuanceBlindingKeyRequestStruct_&)>
  ::~function((function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetIssuanceBlindingKeyRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

BlindingKeyResponseStruct ElementsTransactionStructApi::GetIssuanceBlindingKey(
    const GetIssuanceBlindingKeyRequestStruct& request) {
  auto call_func = [](const GetIssuanceBlindingKeyRequestStruct& request)
      -> BlindingKeyResponseStruct {
    BlindingKeyResponseStruct response;

    ElementsTransactionApi api;
    Privkey blinding_key = api.GetIssuanceBlindingKey(
        Privkey(request.master_blinding_key), Txid(request.txid),
        request.vout);

    response.blinding_key = blinding_key.GetHex();
    return response;
  };

  BlindingKeyResponseStruct result;
  result = ExecuteStructApi<
      GetIssuanceBlindingKeyRequestStruct, BlindingKeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}